

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O0

BayesianGameIdenticalPayoff * BayesianGameIdenticalPayoff::LoadTextFormat(string *filename)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  long *plVar6;
  ulong uVar7;
  size_t sVar8;
  BayesianGameIdenticalPayoff *pBVar9;
  BayesianGameIdenticalPayoff *this;
  undefined8 uVar10;
  string *in_RSI;
  BayesianGameIdenticalPayoff *in_RDI;
  istringstream is;
  string buffer;
  Index jaI;
  Index jtI;
  size_t lineNumber;
  double tempDouble;
  size_t tempInt;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrActions;
  size_t nrAgents;
  ifstream fp;
  BayesianGameIdenticalPayoff *bg;
  Index in_stack_fffffffffffffa08;
  Index in_stack_fffffffffffffa0c;
  BayesianGameIdenticalPayoff *in_stack_fffffffffffffa10;
  BayesianGameIdenticalPayoff *in_stack_fffffffffffffa18;
  BayesianGameIdenticalPayoff *in_stack_fffffffffffffa20;
  char *in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  long *in_stack_fffffffffffffa48;
  BayesianGameBase *in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffb17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffb18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffb20;
  size_t in_stack_fffffffffffffb28;
  BayesianGameIdenticalPayoff *in_stack_fffffffffffffb30;
  istringstream local_428 [384];
  string local_2a8 [36];
  uint local_284;
  uint local_280;
  byte local_279;
  long local_278;
  double local_270;
  ulong local_268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_260;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_248;
  ulong local_230 [3];
  long local_218 [65];
  string *local_10;
  
  local_10 = in_RSI;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_218,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "BayesianGameIdenticalPayoff::LoadTextFormat: failed to ");
    poVar4 = std::operator<<(poVar4,"open file ");
    poVar4 = std::operator<<(poVar4,local_10);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_230[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x8af232);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x8af23f);
  local_268 = 0;
  local_270 = 0.0;
  local_278 = 0;
  local_279 = 0;
  BayesianGameIdenticalPayoff(in_stack_fffffffffffffa10);
  local_280 = 0;
  local_284 = 0;
  std::__cxx11::string::string(local_2a8);
  do {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_218,local_2a8);
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      pBVar9 = (BayesianGameIdenticalPayoff *)(ulong)local_280;
      this = (BayesianGameIdenticalPayoff *)
             BayesianGameBase::GetNrJointTypes((BayesianGameBase *)in_stack_fffffffffffffa20);
      if (pBVar9 == this) {
        SetInitialized(in_RDI,true);
        local_279 = 1;
        std::__cxx11::string::~string(local_2a8);
        if ((local_279 & 1) == 0) {
          ~BayesianGameIdenticalPayoff(this);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
        std::ifstream::~ifstream(local_218);
        return in_RDI;
      }
      uVar10 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
           in_stack_fffffffffffffa38);
      __cxa_throw(uVar10,&E::typeinfo,E::~E);
    }
    std::__cxx11::istringstream::istringstream(local_428,local_2a8,_S_in);
    switch(local_278) {
    case 0:
      break;
    case 1:
      std::istream::operator>>(local_428,local_230);
      break;
    case 2:
      while( true ) {
        plVar6 = (long *)std::istream::operator>>(local_428,&local_268);
        bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
        if (!bVar2) break;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffa20,(value_type_conflict2 *)in_stack_fffffffffffffa18);
      }
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_248);
      if (sVar5 != local_230[0]) {
        uVar10 = __cxa_allocate_exception(0x28);
        E::E((E *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38);
        __cxa_throw(uVar10,&E::typeinfo,E::~E);
      }
      break;
    case 3:
      while( true ) {
        plVar6 = (long *)std::istream::operator>>(local_428,&local_268);
        bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
        if (!bVar2) break;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffa20,(value_type_conflict2 *)in_stack_fffffffffffffa18);
      }
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_260);
      if (sVar5 != local_230[0]) {
        uVar10 = __cxa_allocate_exception(0x28);
        E::E((E *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38);
        __cxa_throw(uVar10,&E::typeinfo,E::~E);
      }
      BayesianGameIdenticalPayoff
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                 in_stack_fffffffffffffb18,(bool)in_stack_fffffffffffffb17);
      operator=(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
      ~BayesianGameIdenticalPayoff(in_stack_fffffffffffffa20);
      break;
    case 4:
      local_280 = 0;
      while( true ) {
        plVar6 = (long *)std::istream::operator>>(local_428,&local_270);
        bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
        if (!bVar2) break;
        BayesianGameBase::SetProbability
                  (in_stack_fffffffffffffa50,(Index)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                   (double)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
        local_280 = local_280 + 1;
      }
      uVar7 = (ulong)local_280;
      sVar8 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)in_stack_fffffffffffffa20);
      if (uVar7 != sVar8) {
        uVar10 = __cxa_allocate_exception(0x28);
        E::E((E *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38);
        __cxa_throw(uVar10,&E::typeinfo,E::~E);
      }
      local_280 = 0;
      break;
    default:
      local_284 = 0;
      while( true ) {
        in_stack_fffffffffffffa48 = (long *)std::istream::operator>>(local_428,&local_270);
        in_stack_fffffffffffffa47 =
             std::ios::operator_cast_to_bool
                       ((ios *)((long)in_stack_fffffffffffffa48 +
                               *(long *)(*in_stack_fffffffffffffa48 + -0x18)));
        if (!(bool)in_stack_fffffffffffffa47) break;
        SetUtility(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08,
                   4.49961443174855e-317);
        local_284 = local_284 + 1;
      }
      pcVar3 = (char *)(ulong)local_284;
      in_stack_fffffffffffffa38 =
           (char *)BayesianGameBase::GetNrJointActions
                             ((BayesianGameBase *)in_stack_fffffffffffffa20);
      if (pcVar3 != in_stack_fffffffffffffa38) {
        uVar10 = __cxa_allocate_exception(0x28);
        E::E((E *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa38);
        __cxa_throw(uVar10,&E::typeinfo,E::~E);
      }
      local_280 = local_280 + 1;
    }
    local_278 = local_278 + 1;
    std::__cxx11::istringstream::~istringstream(local_428);
  } while( true );
}

Assistant:

BayesianGameIdenticalPayoff BayesianGameIdenticalPayoff::LoadTextFormat(const string &filename)
{
    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "BayesianGameIdenticalPayoff::LoadTextFormat: failed to "
             << "open file " << filename << endl;            
    }

    size_t nrAgents=0;
    vector<size_t> nrActions, nrTypes;

    size_t tempInt=0;
    double tempDouble=0;
    size_t lineNumber=0;
    BayesianGameIdenticalPayoff bg;
    Index jtI=0,jaI=0;

    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        switch(lineNumber)
        {
        case 0:
            // skip first line (header)
            break;
        case 1:
            is >> nrAgents;
            break;
        case 2:
            while(is >> tempInt)
                nrActions.push_back(tempInt);
            if(nrActions.size()!=nrAgents)
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of actions"));
            break;
        case 3:
            while(is >> tempInt)
                nrTypes.push_back(tempInt);
            if(nrTypes.size()!=nrAgents)
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of types"));

            // now we have all the info to instantiate the BG
            bg=BayesianGameIdenticalPayoff(nrAgents,nrActions,nrTypes);
            break;
        case 4:
            jtI=0;
            while(is >> tempDouble)
            {
                bg.SetProbability(jtI,tempDouble);
                jtI++;
            }
            if(jtI!=bg.GetNrJointTypes())
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of joint type probabilities"));
            jtI=0;
            break;
        default:
            jaI=0;
            while(is >> tempDouble)
            {
                bg.SetUtility(jtI,jaI,tempDouble);
                jaI++;
            }
            if(jaI!=bg.GetNrJointActions())
                throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of actions in utility function"));
            jtI++;
            break;
        }

        lineNumber++;
    }
        
    if(jtI!=bg.GetNrJointTypes())
        throw(E("BayesianGameIdenticalPayoff::LoadTextFormat wrong number of joint types in utility function"));

    bg.SetInitialized(true);

    return(bg);
}